

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

void am_valgen_ok_proc(Am_Object *cmd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  Am_Wrapper *pAVar6;
  Am_Slot_Key AVar7;
  Am_Object *prev;
  Am_Object valgen_window;
  Am_Object create_cmd;
  Am_Object execute_command;
  int placeholder_cnt;
  Am_Object local_308;
  Am_Object proto;
  Am_Object script_window;
  Am_Object local_2f0;
  Am_Value local_2e8;
  Am_Object script_line;
  Am_Value_List sel_list;
  Am_Value old_val;
  Am_Value_List placeholder_list;
  Am_Value_List part_chain;
  Am_Value new_value;
  Am_Object new_ph;
  
  Am_Object::Get_Object((Am_Object *)&new_value,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&valgen_window,(Am_Slot_Flags)&new_value);
  Am_Object::~Am_Object((Am_Object *)&new_value);
  pAVar4 = Am_Object::Get(&valgen_window,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object(&script_window,pAVar4);
  pAVar4 = Am_Object::Get(&valgen_window,0xc5,0);
  Am_Value_List::Am_Value_List(&sel_list,pAVar4);
  pAVar4 = Am_Object::Get(&valgen_window,0xb8,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&execute_command,pAVar4);
  AVar7 = (Am_Slot_Key)&valgen_window;
  Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_UNDO_OPTIONS);
  pAVar4 = Am_Object::Get((Am_Object *)&new_value,0x169,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object((Am_Object *)&new_value);
  Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_GREEN_AND_YELLOW);
  pAVar4 = Am_Object::Get((Am_Object *)&new_value,0x169,0);
  Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object((Am_Object *)&new_value);
  sort_sel_list_cmd_order
            ((Am_Value_List *)&new_value,(Am_Object *)&sel_list,SUB81(&execute_command,0));
  Am_Value_List::operator=(&sel_list,(Am_Value_List *)&new_value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&new_value);
  Am_Value_List::Am_Value_List(&part_chain);
  proto.data = (Am_Object_Data *)0x0;
  pAVar4 = Am_Value_List::Get_First(&sel_list);
  Am_Object::Am_Object(&script_line,pAVar4);
  pAVar4 = Am_Object::Get(&script_line,0xc5,0);
  Am_Object::Am_Object(&create_cmd,pAVar4);
  Am_Object::Am_Object(&local_308,&Am_Object_Create_Command);
  bVar1 = Am_Object::Is_Instance_Of(&create_cmd,&local_308);
  if (bVar1) {
    Am_Object::~Am_Object(&local_308);
  }
  else {
    Am_Object::Am_Object((Am_Object *)&local_2e8.value,&Am_Find_Command);
    bVar1 = Am_Object::Is_Instance_Of(&create_cmd,(Am_Object *)&local_2e8.value);
    Am_Object::~Am_Object((Am_Object *)&local_2e8.value);
    Am_Object::~Am_Object(&local_308);
    if (!bVar1) {
      Am_Object::operator=(&create_cmd,&Am_No_Object);
    }
  }
  pAVar4 = Am_Object::Get(&valgen_window,0x169,0);
  Am_Value::Am_Value(&old_val,pAVar4);
  pAVar4 = Am_Object::Get(&execute_command,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List(&placeholder_list,pAVar4);
  pAVar4 = Am_Object::Get(&execute_command,Am_PLACEHOLDER_COUNT,0);
  placeholder_cnt = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar3 == 1) {
    Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
    pAVar4 = Am_Object::Get((Am_Object *)&new_value,0xfa,0);
    Am_Value::operator=(&old_val,pAVar4);
    Am_Object::~Am_Object((Am_Object *)&new_value);
    prev = &Am_Constant_Placeholder;
  }
  else if (iVar3 == 4) {
    Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_ALL_FROM_COMMAND_WIDGET);
    pAVar4 = Am_Object::Get((Am_Object *)&new_value,0xfa,3);
    Am_Object::operator=(&create_cmd,pAVar4);
    Am_Object::~Am_Object((Am_Object *)&new_value);
    bVar1 = Am_Object::Valid(&create_cmd);
    if (!bVar1) {
      std::ostrstream::ostrstream((ostrstream *)&new_value,(char *)&new_ph,0xfa,_S_out);
      poVar5 = std::operator<<((ostream *)&new_value,"Command not filled in.");
      std::ends<char,std::char_traits<char>>(poVar5);
      Am_Pop_Up_Error_Window((char *)&new_ph);
      std::ostrstream::~ostrstream((ostrstream *)&new_value);
      goto LAB_0020227b;
    }
    prev = &Am_All_Values_From_Command_Placeholder;
  }
  else if (iVar3 == 0x18) {
    pAVar4 = Am_Object::Get(&valgen_window,Am_REGISTRY_FOR_PALETTES,0);
    Am_Value_List::Add(&part_chain,pAVar4,Am_TAIL,true);
    prev = &Am_Property_From_Palette_Placeholder;
  }
  else if (iVar3 == 0x19) {
    Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_NEXT_CONSTANT_OBJECTS_WIDGET);
    pAVar4 = Am_Object::Get((Am_Object *)&new_value,0xfa,0);
    Am_Value::operator=(&old_val,pAVar4);
    Am_Object::~Am_Object((Am_Object *)&new_value);
    prev = &Am_Cycle_Values_Placeholder;
  }
  else {
    if (iVar3 != 0x65) {
      if (iVar3 == 6) {
        Am_Error("Custom not yet implemented");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar5 = std::operator<<(poVar5,"Bad type ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      Am_Error();
    }
    prev = &Am_Ask_User_Property_Placeholder;
  }
  Am_Object::operator=(&proto,prev);
  Am_Object::Am_Object((Am_Object *)&local_2e8,&proto);
  am_call_create_placeholder
            (&new_ph,&local_2e8,(Am_Object *)&old_val,(Am_Value_List *)&create_cmd,&placeholder_list
             ,(int *)&part_chain,(Am_Slot_Key)&placeholder_cnt);
  Am_Object::~Am_Object((Am_Object *)&local_2e8);
  if (am_sdebug == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ValGen: New placeholder is ");
    poVar5 = operator<<(poVar5,&new_ph);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
  }
  AVar7 = Am_PLACEHOLDER_LIST;
  pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_(&placeholder_list);
  Am_Object::Set(&execute_command,AVar7,pAVar6,0);
  Am_Object::Set(&execute_command,Am_PLACEHOLDER_COUNT,placeholder_cnt,0);
  new_value.type = 0;
  new_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&new_ph);
  Am_Value::operator=(&new_value,pAVar6);
  am_script_replace_all(&sel_list,&new_value,&script_window,(Am_Slot_Key)iVar2,&execute_command);
  Am_Object::Am_Object(&local_2f0,&valgen_window);
  done_with_valgen_window(&local_2f0);
  Am_Object::~Am_Object(&local_2f0);
  Am_Value::~Am_Value(&new_value);
  Am_Object::~Am_Object(&new_ph);
LAB_0020227b:
  Am_Value_List::~Am_Value_List(&placeholder_list);
  Am_Value::~Am_Value(&old_val);
  Am_Object::~Am_Object(&create_cmd);
  Am_Object::~Am_Object(&script_line);
  Am_Object::~Am_Object(&proto);
  Am_Value_List::~Am_Value_List(&part_chain);
  Am_Object::~Am_Object(&execute_command);
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&script_window);
  Am_Object::~Am_Object(&valgen_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_valgen_ok, (Am_Object cmd))
{
  Am_Object valgen_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_window = valgen_window.Get(Am_SCRIPT_WINDOW);
  Am_Value_List sel_list = valgen_window.Get(Am_COMMAND);
  Am_Slot_Key slot = (Am_Slot_Key)(int)valgen_window.Get(Am_SLOTS_TO_SAVE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  int how_gen = valgen_window.Get_Object(Am_UNDO_OPTIONS).Get(Am_VALUE);
  bool modify_first_only =
      (int)(valgen_window.Get_Object(Am_GREEN_AND_YELLOW).Get(Am_VALUE)) ==
      am_generalize_only_green;
  sel_list =
      sort_sel_list_cmd_order(sel_list, execute_command, modify_first_only);
  Am_Value_List part_chain;
  Am_Object proto;
  Am_Object script_line = sel_list.Get_First();
  Am_Object create_cmd = script_line.Get(Am_COMMAND);
  if (!create_cmd.Is_Instance_Of(Am_Object_Create_Command) &&
      !create_cmd.Is_Instance_Of(Am_Find_Command))
    create_cmd = Am_No_Object;
  Am_Value old_val = valgen_window.Get(Am_VALUE);

  Am_Value_List placeholder_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  int placeholder_cnt = execute_command.Get(Am_PLACEHOLDER_COUNT);
  switch (how_gen) {
  case am_constant_generalize:
    old_val =
        valgen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Get(Am_VALUES);
    proto = Am_Constant_Placeholder;
    break;
  case am_palette_generalize:
    part_chain.Add(valgen_window.Get(Am_REGISTRY_FOR_PALETTES)); //hack
    proto = Am_Property_From_Palette_Placeholder;
    break;
  case am_next_value_generalize:
    old_val = valgen_window.Get_Object(Am_NEXT_CONSTANT_OBJECTS_WIDGET)
                  .Get(Am_VALUES);
    proto = Am_Cycle_Values_Placeholder;
    break;
  case am_ask_user_generalize:
    proto = Am_Ask_User_Property_Placeholder;
    break;
  case am_all_values_generalize:
    create_cmd = valgen_window.Get_Object(Am_ALL_FROM_COMMAND_WIDGET)
                     .Get(Am_VALUES, Am_RETURN_ZERO_ON_ERROR);
    if (!create_cmd.Valid()) {
      AM_POP_UP_ERROR_WINDOW("Command not filled in.");
      return; //don't finish with this window
    }
    proto = Am_All_Values_From_Command_Placeholder;
    break;
  case am_custom_generalize: {
    Am_Error("Custom not yet implemented");
    break;
  }
  default:
    Am_ERROR("Bad type " << how_gen);
  } //end switch

  Am_Object new_ph =
      am_call_create_placeholder(proto, old_val, create_cmd, placeholder_list,
                                 part_chain, placeholder_cnt, slot);
  if (am_sdebug)
    std::cout << "ValGen: New placeholder is " << new_ph << std::endl
              << std::flush;
  execute_command.Set(Am_PLACEHOLDER_LIST, placeholder_list);
  execute_command.Set(Am_PLACEHOLDER_COUNT, placeholder_cnt);
  Am_Value new_value;
  new_value = new_ph;
  am_script_replace_all(sel_list, new_value, script_window, slot,
                        execute_command);
  done_with_valgen_window(valgen_window);
}